

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int vcf_parse(kstring_t *s,bcf_hdr_t *h,bcf1_t *v)

{
  kstring_t *s_00;
  uint uVar1;
  int32_t x;
  uint *puVar2;
  long lVar3;
  double dVar4;
  undefined8 q;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  bcf_idpair_t *pbVar9;
  bcf_idpair_t *pbVar10;
  long lVar11;
  bcf_hrec_t *pbVar12;
  byte bVar13;
  byte bVar14;
  anon_union_4_2_947300a4 u;
  char *pcVar15;
  bcf_idpair_t *pbVar16;
  int32_t *a;
  char *pcVar17;
  bcf_idpair_t *pbVar18;
  size_t sVar19;
  uint uVar20;
  size_t sVar21;
  bcf_hdr_t *pbVar22;
  uint uVar23;
  uint uVar24;
  float *a_00;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  float fVar29;
  undefined1 auStack_128 [8];
  ks_tokaux_t aux;
  int l_2;
  undefined1 auStack_e8 [8];
  int l;
  undefined4 uStack_dc;
  bcf_idpair_t *local_d8;
  undefined1 auStack_c8 [8];
  kstring_t tmp;
  bcf_hrec_t **local_a0;
  
  a_00 = (float *)auStack_128;
  bcf_clear(v);
  aux.tab[3] = 0;
  aux.sep = 0;
  aux.finished = 0;
  aux.tab[1] = 0;
  aux.tab[2] = 0;
  auStack_128 = (undefined1  [8])0x0;
  aux.tab[0] = 0;
  pbVar9 = (bcf_idpair_t *)kstrtok(s->s,"\t",(ks_tokaux_t *)auStack_128);
  if (pbVar9 == (bcf_idpair_t *)0x0) {
    return 0;
  }
  s_00 = &v->shared;
  iVar8 = 0;
LAB_0011a0a8:
  q = aux._32_8_;
  *(undefined1 *)aux._32_8_ = 0;
  iVar25 = aux.sep;
  switch(iVar8) {
  case 0:
    puVar2 = (uint *)h->dict[1];
    uVar23 = *puVar2;
    if (uVar23 == 0) {
      uVar27 = 0;
LAB_0011ac1c:
      if ((uint)uVar27 == uVar23) goto LAB_0011ad14;
    }
    else {
      uVar24 = (uint)*(char *)&pbVar9->key;
      if (*(char *)&pbVar9->key == '\0') {
        uVar24 = 0;
      }
      else {
        cVar5 = *(char *)((long)&pbVar9->key + 1);
        if (cVar5 != '\0') {
          pcVar15 = (char *)((long)&pbVar9->key + 2);
          do {
            uVar24 = (int)cVar5 + uVar24 * 0x1f;
            cVar5 = *pcVar15;
            pcVar15 = pcVar15 + 1;
          } while (cVar5 != '\0');
        }
      }
      uVar24 = uVar24 & uVar23 - 1;
      lVar11 = *(long *)(puVar2 + 4);
      iVar25 = 1;
      uVar20 = uVar24;
      do {
        uVar1 = *(uint *)(lVar11 + (ulong)(uVar20 >> 4) * 4);
        bVar14 = (char)uVar20 * '\x02' & 0x1e;
        uVar6 = uVar1 >> bVar14;
        if ((uVar6 & 2) != 0) {
LAB_0011ac0c:
          uVar27 = (ulong)uVar20;
          if ((uVar1 >> bVar14 & 3) != 0) {
            uVar27 = (ulong)uVar23;
          }
          goto LAB_0011ac1c;
        }
        if ((uVar6 & 1) == 0) {
          pcVar15 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar20 * 8);
          *(undefined8 *)((long)a_00 + -8) = 0x11abea;
          iVar7 = strcmp(pcVar15,(char *)pbVar9);
          if (iVar7 == 0) goto LAB_0011ac0c;
        }
        uVar20 = uVar20 + iVar25 & uVar23 - 1;
        iVar25 = iVar25 + 1;
      } while (uVar20 != uVar24);
LAB_0011ad14:
      *(undefined8 *)((long)a_00 + -8) = 0x11ad39;
      fprintf(_stderr,
              "[W::%s] contig \'%s\' is not defined in the header. (Quick workaround: index the file with tabix.)\n"
              ,"vcf_parse",pbVar9);
      auStack_c8 = (undefined1  [8])0x0;
      tmp.l = 0;
      tmp.m = 0;
      pbVar22 = (bcf_hdr_t *)auStack_c8;
      *(undefined8 *)((long)a_00 + -8) = 0x11ad6a;
      ksprintf((kstring_t *)pbVar22,"##contig=<ID=%s>",pbVar9);
      sVar19 = tmp.m;
      *(undefined8 *)((long)a_00 + -8) = 0x11ad7d;
      pbVar12 = bcf_hdr_parse_line(pbVar22,(char *)sVar19,(int *)auStack_e8);
      sVar19 = tmp.m;
      *(undefined8 *)((long)a_00 + -8) = 0x11ad8c;
      free((void *)sVar19);
      *(undefined8 *)((long)a_00 + -8) = 0x11ad9b;
      iVar25 = bcf_hdr_add_hrec(h,pbVar12);
      if (iVar25 != 0) {
        *(undefined8 *)((long)a_00 + -8) = 0x11ada7;
        bcf_hdr_sync(h);
      }
      uVar23 = *puVar2;
      uVar27 = (ulong)uVar23;
      if (uVar23 == 0) {
        uVar27 = 0;
      }
      else {
        uVar24 = (uint)*(char *)&pbVar9->key;
        if (*(char *)&pbVar9->key == '\0') {
          uVar24 = 0;
        }
        else {
          cVar5 = *(char *)((long)&pbVar9->key + 1);
          if (cVar5 != '\0') {
            pcVar15 = (char *)((long)&pbVar9->key + 2);
            do {
              uVar24 = (int)cVar5 + uVar24 * 0x1f;
              cVar5 = *pcVar15;
              pcVar15 = pcVar15 + 1;
            } while (cVar5 != '\0');
          }
        }
        uVar24 = uVar24 & uVar23 - 1;
        lVar11 = *(long *)(puVar2 + 4);
        iVar25 = 1;
        uVar20 = uVar24;
        do {
          uVar1 = *(uint *)(lVar11 + (ulong)(uVar20 >> 4) * 4);
          bVar14 = (char)uVar20 * '\x02' & 0x1e;
          uVar6 = uVar1 >> bVar14;
          if ((uVar6 & 2) != 0) {
LAB_0011ae6f:
            if ((uVar1 >> bVar14 & 3) == 0) {
              uVar27 = (ulong)uVar20;
            }
            break;
          }
          if ((uVar6 & 1) == 0) {
            pcVar15 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar20 * 8);
            *(undefined8 *)((long)a_00 + -8) = 0x11ae4d;
            iVar7 = strcmp(pcVar15,(char *)pbVar9);
            if (iVar7 == 0) goto LAB_0011ae6f;
          }
          uVar20 = uVar20 + iVar25 & uVar23 - 1;
          iVar25 = iVar25 + 1;
        } while (uVar20 != uVar24);
      }
      v->errcode = 1;
    }
    v->rid = *(int32_t *)(*(long *)(puVar2 + 8) + 0x28 + uVar27 * 0x30);
    break;
  case 1:
    *(undefined8 *)((long)a_00 + -8) = 0x11a7e6;
    iVar25 = atoi((char *)pbVar9);
    v->pos = iVar25 - 1;
    break;
  case 2:
    if ((*(char *)&pbVar9->key == '.') && (*(char *)((long)&pbVar9->key + 1) == '\0')) {
      sVar19 = (v->shared).l;
      uVar27 = sVar19 + 1;
      if (uVar27 < (v->shared).m) {
        pcVar15 = (v->shared).s;
      }
      else {
        uVar27 = uVar27 >> 1 | uVar27;
        uVar27 = uVar27 >> 2 | uVar27;
        uVar27 = uVar27 >> 4 | uVar27;
        uVar27 = uVar27 >> 8 | uVar27;
        sVar21 = (uVar27 >> 0x10 | uVar27) + 1;
        (v->shared).m = sVar21;
        pcVar15 = (v->shared).s;
        *(undefined8 *)((long)a_00 + -8) = 0x11ace1;
        pcVar15 = (char *)realloc(pcVar15,sVar21);
        if (pcVar15 == (char *)0x0) break;
        (v->shared).s = pcVar15;
        sVar19 = (v->shared).l;
        uVar27 = sVar19 + 1;
      }
      (v->shared).l = uVar27;
      pcVar15[sVar19] = '\a';
      (v->shared).s[(v->shared).l] = '\0';
    }
    else {
      *(undefined8 *)((long)a_00 + -8) = 0x11a1bc;
      bcf_enc_vchar(s_00,iVar25 - (int)pbVar9,(char *)pbVar9);
    }
    break;
  case 3:
    iVar25 = iVar25 - (int)pbVar9;
    *(undefined8 *)((long)a_00 + -8) = 0x11a1d3;
    bcf_enc_vchar(s_00,iVar25,(char *)pbVar9);
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffff0000ffff | 0x10000;
    v->rlen = iVar25;
    break;
  case 4:
    if ((*(char *)&pbVar9->key != '.') || (*(char *)((long)&pbVar9->key + 1) != '\0')) {
      uVar27 = (ulong)pbVar9 & 0xffffffff;
      pbVar16 = pbVar9;
      do {
        pbVar18 = (bcf_idpair_t *)((long)&pbVar16->key + 1);
        if ((*(char *)&pbVar16->key == ',') || (*(char *)&pbVar16->key == '\0')) {
          *(undefined8 *)((long)a_00 + -8) = 0x11a15a;
          bcf_enc_vchar(s_00,(int)uVar27 - (int)pbVar9,(char *)pbVar9);
          *(ulong *)&v->field_0x10 =
               *(ulong *)&v->field_0x10 & 0xffffffff0000ffff |
               (ulong)((int)*(ulong *)&v->field_0x10 + 0x10000U & 0xffff0000);
          pbVar9 = pbVar18;
        }
        uVar27 = (ulong)((int)uVar27 + 1);
        bVar28 = pbVar16 != (bcf_idpair_t *)q;
        pbVar16 = pbVar18;
      } while (bVar28);
    }
    break;
  case 5:
    if ((*(char *)&pbVar9->key != '.') ||
       (fVar29 = (float)bcf_float_missing, *(char *)((long)&pbVar9->key + 1) != '\0')) {
      *(undefined8 *)((long)a_00 + -8) = 0x11a80b;
      dVar4 = atof((char *)pbVar9);
      fVar29 = (float)dVar4;
    }
    v->qual = fVar29;
    if (v->max_unpack == 1) {
      return 0;
    }
    break;
  case 6:
    if ((*(char *)&pbVar9->key != '.') || (*(char *)((long)&pbVar9->key + 1) != '\0')) {
      puVar2 = (uint *)h->dict[0];
      if (*(char *)(aux._32_8_ + -1) == ';') {
        *(undefined1 *)(aux._32_8_ + -1) = 0;
      }
      iVar25 = 1;
      pbVar16 = pbVar9;
      do {
        if (*(char *)&pbVar16->key == ';') {
          iVar25 = iVar25 + 1;
        }
        else if (*(char *)&pbVar16->key == '\0') goto LAB_0011a86c;
        pbVar16 = (bcf_idpair_t *)((long)&pbVar16->key + 1);
      } while( true );
    }
    iVar25 = 0;
    a = (int32_t *)0x0;
    goto LAB_0011ab68;
  case 7:
    puVar2 = (uint *)h->dict[0];
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffffff0000;
    if ((*(char *)&pbVar9->key != '.') || (*(char *)((long)&pbVar9->key + 1) != '\0')) {
      pbVar16 = pbVar9;
      if (*(char *)(aux._32_8_ + -1) == ';') {
        *(undefined1 *)(aux._32_8_ + -1) = 0;
      }
LAB_0011a22f:
      bVar14 = *(byte *)&pbVar9->key;
      if ((0x3d < (ulong)bVar14) || ((0x2800000000000001U >> ((ulong)bVar14 & 0x3f) & 1) == 0))
      goto LAB_0011a6fe;
      *(char *)&pbVar9->key = '\0';
      if (bVar14 == 0x3d) {
        pbVar18 = (bcf_idpair_t *)((long)&pbVar9->key + 1);
        for (pbVar9 = pbVar18; (bVar14 = *(byte *)&pbVar9->key, bVar14 != 0 && (bVar14 != 0x3b));
            pbVar9 = (bcf_idpair_t *)((long)&pbVar9->key + 1)) {
        }
        *(char *)&pbVar9->key = '\0';
      }
      else {
        pbVar18 = (bcf_idpair_t *)0x0;
      }
      uVar23 = (uint)*(char *)&pbVar16->key;
      if (*(char *)&pbVar16->key != '\0') {
        uVar24 = *puVar2;
        if (uVar24 == 0) {
          uVar20 = 0;
LAB_0011a371:
          if (uVar20 == uVar24) goto LAB_0011a583;
          uVar27 = (ulong)uVar20;
          uVar23 = *(uint *)(*(long *)(puVar2 + 8) + 4 + uVar27 * 0x30);
          if (uVar23 == 0xf) goto LAB_0011a583;
        }
        else {
          cVar5 = *(char *)((long)&pbVar16->key + 1);
          if (cVar5 != '\0') {
            pcVar15 = (char *)((long)&pbVar16->key + 2);
            do {
              uVar23 = (int)cVar5 + uVar23 * 0x1f;
              cVar5 = *pcVar15;
              pcVar15 = pcVar15 + 1;
            } while (cVar5 != '\0');
          }
          uVar23 = uVar23 & uVar24 - 1;
          lVar11 = *(long *)(puVar2 + 4);
          iVar25 = 1;
          uVar20 = uVar23;
          do {
            uVar1 = *(uint *)(lVar11 + (ulong)(uVar20 >> 4) * 4);
            bVar13 = (char)uVar20 * '\x02' & 0x1e;
            uVar6 = uVar1 >> bVar13;
            if ((uVar6 & 2) != 0) {
LAB_0011a34c:
              if ((uVar1 >> bVar13 & 3) != 0) {
                uVar20 = uVar24;
              }
              goto LAB_0011a371;
            }
            if ((uVar6 & 1) == 0) {
              pcVar15 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar20 * 8);
              *(undefined8 *)((long)a_00 + -8) = 0x11a32b;
              iVar7 = strcmp(pcVar15,(char *)pbVar16);
              if (iVar7 == 0) goto LAB_0011a34c;
            }
            uVar20 = uVar20 + iVar25 & uVar24 - 1;
            iVar25 = iVar25 + 1;
          } while (uVar20 != uVar23);
LAB_0011a583:
          *(undefined8 *)((long)a_00 + -8) = 0x11a5a8;
          fprintf(_stderr,"[W::%s] INFO \'%s\' is not defined in the header, assuming Type=String\n"
                  ,"vcf_parse",pbVar16);
          auStack_c8 = (undefined1  [8])0x0;
          tmp.l = 0;
          tmp.m = 0;
          pbVar22 = (bcf_hdr_t *)auStack_c8;
          *(undefined8 *)((long)a_00 + -8) = 0x11a5d5;
          ksprintf((kstring_t *)pbVar22,"##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">",
                   pbVar16);
          sVar19 = tmp.m;
          *(undefined8 *)((long)a_00 + -8) = 0x11a5e8;
          pbVar12 = bcf_hdr_parse_line(pbVar22,(char *)sVar19,(int *)auStack_e8);
          sVar19 = tmp.m;
          *(undefined8 *)((long)a_00 + -8) = 0x11a5f7;
          free((void *)sVar19);
          *(undefined8 *)((long)a_00 + -8) = 0x11a606;
          iVar25 = bcf_hdr_add_hrec(h,pbVar12);
          if (iVar25 != 0) {
            *(undefined8 *)((long)a_00 + -8) = 0x11a612;
            bcf_hdr_sync(h);
          }
          uVar23 = *puVar2;
          uVar27 = (ulong)uVar23;
          if (uVar23 == 0) {
            uVar27 = 0;
          }
          else {
            uVar24 = (uint)*(char *)&pbVar16->key;
            if (*(char *)&pbVar16->key == '\0') {
              uVar24 = 0;
            }
            else {
              cVar5 = *(char *)((long)&pbVar16->key + 1);
              if (cVar5 != '\0') {
                pcVar15 = (char *)((long)&pbVar16->key + 2);
                do {
                  uVar24 = (int)cVar5 + uVar24 * 0x1f;
                  cVar5 = *pcVar15;
                  pcVar15 = pcVar15 + 1;
                } while (cVar5 != '\0');
              }
            }
            uVar24 = uVar24 & uVar23 - 1;
            lVar11 = *(long *)(puVar2 + 4);
            iVar25 = 1;
            uVar20 = uVar24;
            do {
              uVar1 = *(uint *)(lVar11 + (ulong)(uVar20 >> 4) * 4);
              bVar13 = (char)uVar20 * '\x02' & 0x1e;
              uVar6 = uVar1 >> bVar13;
              if ((uVar6 & 2) != 0) {
LAB_0011a78c:
                if ((uVar1 >> bVar13 & 3) == 0) {
                  uVar27 = (ulong)uVar20;
                }
                break;
              }
              if ((uVar6 & 1) == 0) {
                pcVar15 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar20 * 8);
                *(undefined8 *)((long)a_00 + -8) = 0x11a766;
                iVar7 = strcmp(pcVar15,(char *)pbVar16);
                if (iVar7 == 0) goto LAB_0011a78c;
              }
              uVar20 = uVar20 + iVar25 & uVar23 - 1;
              iVar25 = iVar25 + 1;
            } while (uVar20 != uVar24);
          }
          v->errcode = 2;
          uVar23 = *(uint *)(*(long *)(puVar2 + 8) + 4 + uVar27 * 0x30);
        }
        *(short *)&v->field_0x10 = *(short *)&v->field_0x10 + 1;
        x = *(int32_t *)(*(long *)(puVar2 + 8) + 0x28 + uVar27 * 0x30);
        *(undefined8 *)((long)a_00 + -8) = 0x11a3bf;
        bcf_enc_int1(s_00,x);
        if (pbVar18 == (bcf_idpair_t *)0x0) {
          sVar19 = (v->shared).l;
          uVar27 = sVar19 + 1;
          if (uVar27 < (v->shared).m) {
            pcVar15 = (v->shared).s;
          }
          else {
            uVar27 = uVar27 >> 1 | uVar27;
            uVar27 = uVar27 >> 2 | uVar27;
            uVar27 = uVar27 >> 4 | uVar27;
            uVar27 = uVar27 >> 8 | uVar27;
            sVar21 = (uVar27 >> 0x10 | uVar27) + 1;
            (v->shared).m = sVar21;
            pcVar15 = (v->shared).s;
            *(undefined8 *)((long)a_00 + -8) = 0x11a54a;
            pcVar15 = (char *)realloc(pcVar15,sVar21);
            if (pcVar15 == (char *)0x0) goto LAB_0011a6f1;
            (v->shared).s = pcVar15;
            sVar19 = (v->shared).l;
            uVar27 = sVar19 + 1;
          }
          (v->shared).l = uVar27;
          pcVar15[sVar19] = '\0';
          (v->shared).s[(v->shared).l] = '\0';
        }
        else {
          uVar23 = uVar23 >> 4 & 0xf;
          if ((uVar23 != 3) && (uVar23 != 0)) {
            uVar27 = 1;
            pbVar10 = pbVar18;
            do {
              iVar25 = (int)uVar27;
              if (*(char *)&pbVar10->key == ',') {
                uVar27 = (ulong)(iVar25 + 1);
              }
              else if (*(char *)&pbVar10->key == '\0') goto LAB_0011a43d;
              pbVar10 = (bcf_idpair_t *)((long)&pbVar10->key + 1);
            } while( true );
          }
          *(undefined8 *)((long)a_00 + -8) = 0x11a3f3;
          bcf_enc_vchar(s_00,(int)pbVar9 - (int)pbVar18,(char *)pbVar18);
        }
        goto LAB_0011a6f1;
      }
      if (bVar14 != 0) goto LAB_0011a6fa;
    }
LAB_0011a7c6:
    if (v->max_unpack - 1U < 7) {
      return 0;
    }
    break;
  case 8:
    *(undefined8 *)((long)a_00 + -8) = 0x11aebe;
    iVar8 = _vcf_parse_format(s,h,v,(char *)pbVar9,(char *)q);
    return iVar8;
  }
  goto switchD_0011a0d0_default;
LAB_0011a43d:
  if (uVar23 == 2) {
    a_00 = (float *)((long)a_00 + -((long)iVar25 * 4 + 0xfU & 0xfffffffffffffff0));
    if (0 < iVar25) {
      uVar26 = 0;
      do {
        a_00[-2] = 1.620955e-39;
        a_00[-1] = 0.0;
        dVar4 = strtod((char *)pbVar18,(char **)auStack_c8);
        a_00[uVar26] = (float)dVar4;
        if (auStack_c8 == (undefined1  [8])pbVar18) {
          a_00[uVar26] = (float)bcf_float_missing;
          for (; (*(char *)&((bcf_idpair_t *)auStack_c8)->key != '\0' &&
                 (*(char *)&((bcf_idpair_t *)auStack_c8)->key != ','));
              auStack_c8 = (undefined1  [8])((long)&((bcf_idpair_t *)auStack_c8)->key + 1)) {
          }
        }
        uVar26 = uVar26 + 1;
        pbVar18 = (bcf_idpair_t *)((long)(char **)auStack_c8 + 1);
      } while (uVar26 != uVar27);
    }
    a_00[-2] = 1.621074e-39;
    a_00[-1] = 0.0;
    bcf_enc_vfloat(s_00,iVar25,a_00);
  }
  else if (uVar23 == 1) {
    a_00 = (float *)((long)a_00 + -((long)iVar25 * 4 + 0xfU & 0xfffffffffffffff0));
    if (0 < iVar25) {
      uVar26 = 0;
      do {
        ((int32_t *)a_00)[-2] = 0x11a486;
        ((int32_t *)a_00)[-1] = 0;
        lVar11 = strtol((char *)pbVar18,(char **)auStack_c8,10);
        ((int32_t *)a_00)[uVar26] = (int32_t)lVar11;
        if (auStack_c8 == (undefined1  [8])pbVar18) {
          ((int32_t *)a_00)[uVar26] = -0x80000000;
          for (; (*(char *)&((bcf_idpair_t *)auStack_c8)->key != '\0' &&
                 (*(char *)&((bcf_idpair_t *)auStack_c8)->key != ','));
              auStack_c8 = (undefined1  [8])((long)&((bcf_idpair_t *)auStack_c8)->key + 1)) {
          }
        }
        uVar26 = uVar26 + 1;
        pbVar18 = (bcf_idpair_t *)((long)(char **)auStack_c8 + 1);
      } while (uVar26 != uVar27);
    }
    ((int32_t *)a_00)[-2] = 0x11a4d8;
    ((int32_t *)a_00)[-1] = 0;
    bcf_enc_vint(s_00,iVar25,(int32_t *)a_00,-1);
    ((int32_t *)a_00)[-2] = 0x11a4e8;
    ((int32_t *)a_00)[-1] = 0;
    iVar25 = strcmp((char *)pbVar16,"END");
    if (iVar25 == 0) {
      v->rlen = (int)*a_00 - v->pos;
    }
  }
LAB_0011a6f1:
  if (bVar14 == 0) goto LAB_0011a7c6;
LAB_0011a6fa:
  pbVar16 = (bcf_idpair_t *)((long)&pbVar9->key + 1);
LAB_0011a6fe:
  pbVar9 = (bcf_idpair_t *)((long)&pbVar9->key + 1);
  goto LAB_0011a22f;
LAB_0011a86c:
  a = (int32_t *)((long)a_00 + -((long)iVar25 * 4 + 0xfU & 0xfffffffffffffff0));
  a[-2] = 0x11a8a0;
  a[-1] = 0;
  pcVar15 = kstrtok((char *)pbVar9,";",(ks_tokaux_t *)auStack_c8);
  if (pcVar15 == (char *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    do {
      *(char *)local_a0 = '\0';
      uVar23 = *puVar2;
      if (uVar23 == 0) {
        uVar27 = 0;
LAB_0011a988:
        if ((uint)uVar27 == uVar23) goto LAB_0011a9d7;
      }
      else {
        uVar24 = (uint)*pcVar15;
        if (*pcVar15 == '\0') {
          uVar24 = 0;
        }
        else {
          cVar5 = pcVar15[1];
          if (cVar5 != '\0') {
            pcVar17 = pcVar15 + 2;
            do {
              uVar24 = (int)cVar5 + uVar24 * 0x1f;
              cVar5 = *pcVar17;
              pcVar17 = pcVar17 + 1;
            } while (cVar5 != '\0');
          }
        }
        uVar24 = uVar24 & uVar23 - 1;
        lVar3 = *(long *)(puVar2 + 4);
        iVar25 = 1;
        uVar20 = uVar24;
        do {
          uVar1 = *(uint *)(lVar3 + (ulong)(uVar20 >> 4) * 4);
          bVar14 = (char)uVar20 * '\x02' & 0x1e;
          uVar6 = uVar1 >> bVar14;
          if ((uVar6 & 2) != 0) {
LAB_0011a976:
            uVar27 = (ulong)uVar20;
            if ((uVar1 >> bVar14 & 3) != 0) {
              uVar27 = (ulong)uVar23;
            }
            goto LAB_0011a988;
          }
          if ((uVar6 & 1) == 0) {
            pcVar17 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar20 * 8);
            a[-2] = 0x11a957;
            a[-1] = 0;
            iVar7 = strcmp(pcVar17,pcVar15);
            if (iVar7 == 0) goto LAB_0011a976;
          }
          uVar20 = uVar20 + iVar25 & uVar23 - 1;
          iVar25 = iVar25 + 1;
        } while (uVar20 != uVar24);
LAB_0011a9d7:
        a[-2] = 0x11a9fc;
        a[-1] = 0;
        fprintf(_stderr,"[W::%s] FILTER \'%s\' is not defined in the header\n","vcf_parse",pcVar15);
        auStack_e8._0_4_ = 0;
        auStack_e8._4_4_ = 0;
        l = 0;
        uStack_dc = 0;
        local_d8 = (bcf_idpair_t *)0x0;
        pbVar22 = (bcf_hdr_t *)auStack_e8;
        a[-2] = 0x11aa2d;
        a[-1] = 0;
        ksprintf((kstring_t *)pbVar22,"##FILTER=<ID=%s,Description=\"Dummy\">",pcVar15);
        pbVar9 = local_d8;
        a[-2] = 0x11aa40;
        a[-1] = 0;
        pbVar12 = bcf_hdr_parse_line(pbVar22,(char *)pbVar9,(int *)((long)&aux.p + 4));
        pbVar9 = local_d8;
        a[-2] = 0x11aa4f;
        a[-1] = 0;
        free(pbVar9);
        a[-2] = 0x11aa5e;
        a[-1] = 0;
        iVar25 = bcf_hdr_add_hrec(h,pbVar12);
        if (iVar25 != 0) {
          a[-2] = 0x11aa6a;
          a[-1] = 0;
          bcf_hdr_sync(h);
        }
        uVar23 = *puVar2;
        uVar27 = (ulong)uVar23;
        if (uVar23 == 0) {
          uVar27 = 0;
        }
        else {
          uVar24 = (uint)*pcVar15;
          if (*pcVar15 == '\0') {
            uVar24 = 0;
          }
          else {
            cVar5 = pcVar15[1];
            if (cVar5 != '\0') {
              pcVar17 = pcVar15 + 2;
              do {
                uVar24 = (int)cVar5 + uVar24 * 0x1f;
                cVar5 = *pcVar17;
                pcVar17 = pcVar17 + 1;
              } while (cVar5 != '\0');
            }
          }
          uVar24 = uVar24 & uVar23 - 1;
          lVar3 = *(long *)(puVar2 + 4);
          iVar25 = 1;
          uVar20 = uVar24;
          do {
            uVar1 = *(uint *)(lVar3 + (ulong)(uVar20 >> 4) * 4);
            bVar14 = (char)uVar20 * '\x02' & 0x1e;
            uVar6 = uVar1 >> bVar14;
            if ((uVar6 & 2) != 0) {
LAB_0011ab28:
              if ((uVar1 >> bVar14 & 3) == 0) {
                uVar27 = (ulong)uVar20;
              }
              break;
            }
            if ((uVar6 & 1) == 0) {
              pcVar17 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar20 * 8);
              a[-2] = 0x11ab05;
              a[-1] = 0;
              iVar7 = strcmp(pcVar17,pcVar15);
              if (iVar7 == 0) goto LAB_0011ab28;
            }
            uVar20 = uVar20 + iVar25 & uVar23 - 1;
            iVar25 = iVar25 + 1;
          } while (uVar20 != uVar24);
        }
        v->errcode = 2;
      }
      a[lVar11] = *(int32_t *)(*(long *)(puVar2 + 8) + 0x28 + uVar27 * 0x30);
      lVar11 = lVar11 + 1;
      a[-2] = 0x11a9c6;
      a[-1] = 0;
      pcVar15 = kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)auStack_c8);
    } while (pcVar15 != (char *)0x0);
  }
  iVar25 = (int)lVar11;
  a_00 = (float *)a;
LAB_0011ab68:
  ((int32_t *)a_00)[-2] = 0x11ab72;
  ((int32_t *)a_00)[-1] = 0;
  bcf_enc_vint(s_00,iVar25,a,-1);
  if (v->max_unpack - 1U < 3) {
    return 0;
  }
switchD_0011a0d0_default:
  *(undefined8 *)((long)a_00 + -8) = 0x11ac57;
  pbVar9 = (bcf_idpair_t *)kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)auStack_128);
  iVar8 = iVar8 + 1;
  if (pbVar9 == (bcf_idpair_t *)0x0) {
    return 0;
  }
  goto LAB_0011a0a8;
}

Assistant:

int vcf_parse(kstring_t *s, const bcf_hdr_t *h, bcf1_t *v)
{
    int i = 0;
    char *p, *q, *r, *t;
    kstring_t *str;
    khint_t k;
    ks_tokaux_t aux;

    bcf_clear1(v);
    str = &v->shared;
    memset(&aux, 0, sizeof(ks_tokaux_t));
    for (p = kstrtok(s->s, "\t", &aux), i = 0; p; p = kstrtok(0, 0, &aux), ++i) {
        q = (char*)aux.p;
        *q = 0;
        if (i == 0) { // CHROM
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_CTG];
            k = kh_get(vdict, d, p);
            if (k == kh_end(d))
            {
                // Simple error recovery for chromosomes not defined in the header. It will not help when VCF header has
                // been already printed, but will enable tools like vcfcheck to proceed.
                fprintf(stderr, "[W::%s] contig '%s' is not defined in the header. (Quick workaround: index the file with tabix.)\n", __func__, p);
                kstring_t tmp = {0,0,0};
                int l;
                ksprintf(&tmp, "##contig=<ID=%s>", p);
                bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                free(tmp.s);
                if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                k = kh_get(vdict, d, p);
                v->errcode = BCF_ERR_CTG_UNDEF;
            }
            v->rid = kh_val(d, k).id;
        } else if (i == 1) { // POS
            v->pos = atoi(p) - 1;
        } else if (i == 2) { // ID
            if (strcmp(p, ".")) bcf_enc_vchar(str, q - p, p);
            else bcf_enc_size(str, 0, BCF_BT_CHAR);
        } else if (i == 3) { // REF
            bcf_enc_vchar(str, q - p, p);
            v->n_allele = 1, v->rlen = q - p;
        } else if (i == 4) { // ALT
            if (strcmp(p, ".")) {
                for (r = t = p;; ++r) {
                    if (*r == ',' || *r == 0) {
                        bcf_enc_vchar(str, r - t, t);
                        t = r + 1;
                        ++v->n_allele;
                    }
                    if (r == q) break;
                }
            }
        } else if (i == 5) { // QUAL
            if (strcmp(p, ".")) v->qual = atof(p);
            else memcpy(&v->qual, &bcf_float_missing, 4);
            if ( v->max_unpack && !(v->max_unpack>>1) ) return 0; // BCF_UN_STR
        } else if (i == 6) { // FILTER
            if (strcmp(p, ".")) {
                int32_t *a;
                int n_flt = 1, i;
                ks_tokaux_t aux1;
                vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
                // count the number of filters
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = p; *r; ++r)
                    if (*r == ';') ++n_flt;
                a = (int32_t*)alloca(n_flt * sizeof(int32_t));
                // add filters
                for (t = kstrtok(p, ";", &aux1), i = 0; t; t = kstrtok(0, 0, &aux1)) {
                    *(char*)aux1.p = 0;
                    k = kh_get(vdict, d, t);
                    if (k == kh_end(d))
                    {
                        // Simple error recovery for FILTERs not defined in the header. It will not help when VCF header has
                        // been already printed, but will enable tools like vcfcheck to proceed.
                        fprintf(stderr, "[W::%s] FILTER '%s' is not defined in the header\n", __func__, t);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##FILTER=<ID=%s,Description=\"Dummy\">", t);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, t);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    a[i++] = kh_val(d, k).id;
                }
                n_flt = i;
                bcf_enc_vint(str, n_flt, a, -1);
            } else bcf_enc_vint(str, 0, 0, -1);
            if ( v->max_unpack && !(v->max_unpack>>2) ) return 0;    // BCF_UN_FLT
        } else if (i == 7) { // INFO
            char *key;
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
            v->n_info = 0;
            if (strcmp(p, ".")) {
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = key = p;; ++r) {
                    int c;
                    char *val, *end;
                    if (*r != ';' && *r != '=' && *r != 0) continue;
                    val = end = 0;
                    c = *r; *r = 0;
                    if (c == '=') {
                        val = r + 1;
                        for (end = val; *end != ';' && *end != 0; ++end);
                        c = *end; *end = 0;
                    } else end = r;
                    if ( !*key ) { if (c==0) break; r = end; key = r + 1; continue; }  // faulty VCF, ";;" in the INFO
                    k = kh_get(vdict, d, key);
                    if (k == kh_end(d) || kh_val(d, k).info[BCF_HL_INFO] == 15)
                    {
                        fprintf(stderr, "[W::%s] INFO '%s' is not defined in the header, assuming Type=String\n", __func__, key);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">", key);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, key);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    uint32_t y = kh_val(d, k).info[BCF_HL_INFO];
                    ++v->n_info;
                    bcf_enc_int1(str, kh_val(d, k).id);
                    if (val == 0) {
                        bcf_enc_size(str, 0, BCF_BT_NULL);
                    } else if ((y>>4&0xf) == BCF_HT_FLAG || (y>>4&0xf) == BCF_HT_STR) { // if Flag has a value, treat it as a string
                        bcf_enc_vchar(str, end - val, val);
                    } else { // int/float value/array
                        int i, n_val;
                        char *t, *te;
                        for (t = val, n_val = 1; *t; ++t) // count the number of values
                            if (*t == ',') ++n_val;
                        if ((y>>4&0xf) == BCF_HT_INT) {
                            int32_t *z;
                            z = (int32_t*)alloca(n_val * sizeof(int32_t));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtol(t, &te, 10);
                                if ( te==t ) // conversion failed
                                {
                                    z[i] = bcf_int32_missing;
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vint(str, n_val, z, -1);
                            if (strcmp(key, "END") == 0) v->rlen = z[0] - v->pos;
                        } else if ((y>>4&0xf) == BCF_HT_REAL) {
                            float *z;
                            z = (float*)alloca(n_val * sizeof(float));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtod(t, &te);
                                if ( te==t ) // conversion failed
                                {
                                    bcf_float_set_missing(z[i]);
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vfloat(str, n_val, z);
                        }
                    }
                    if (c == 0) break;
                    r = end;
                    key = r + 1;
                }
            }
            if ( v->max_unpack && !(v->max_unpack>>3) ) return 0;
        } else if (i == 8) // FORMAT
            return _vcf_parse_format(s, h, v, p, q);
    }
    return 0;
}